

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::toTerrain(Mesh *__return_storage_ptr__,Image *_image,float _zScale,float _maxError,
                      float _baseHeight,int _maxTriangles,int _maxPoints)

{
  float fVar1;
  vec<2,_int,_(glm::qualifier)0> vVar2;
  vec<2,_int,_(glm::qualifier)0> vVar3;
  vec<2,_int,_(glm::qualifier)0> vVar4;
  bool bVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar16;
  mapped_type_conflict1 *pmVar17;
  mapped_type *pmVar18;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar19;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar20;
  int i_2;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar21;
  pointer _point;
  vec2 *_uv;
  pointer pvVar22;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar23;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar24;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar25;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar26;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar27;
  int i;
  ulong uVar28;
  int i_1;
  pointer piVar29;
  float extraout_XMM0_Da;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  mapped_type_conflict1 local_35c;
  int h1;
  int p11;
  int p10;
  int p01;
  int p00;
  int w1;
  ulong local_340;
  ulong local_338;
  int center;
  float local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  uint local_30c;
  Mesh *local_308;
  int local_300;
  float local_2fc;
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  triangles;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  points;
  anon_class_40_5_2ea28a1b pointIndex;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoords;
  ivec2 p;
  __node_base_ptr p_Stack_238;
  ulong local_230;
  ulong local_228;
  long local_220;
  long local_218;
  anon_class_8_1_898a9ca8 handleCollinear;
  _Rb_tree_node_base local_208;
  size_t local_1e8;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sy1s;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sy0s;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sx1s;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sx0s;
  TriangulatorData data;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> y1s;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> y0s;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> x1s;
  
  local_338 = CONCAT44(local_338._4_4_,_maxTriangles);
  local_328 = _baseHeight;
  uStack_324 = in_XMM2_Db;
  uStack_320 = in_XMM2_Dc;
  uStack_31c = in_XMM2_Dd;
  local_30c = _maxPoints;
  local_2fc = _maxError;
  iVar9 = (*_image->_vptr_Image[8])(_image);
  if (iVar9 == 1) {
    memset(&data,0,0xc0);
    iVar9 = (*_image->_vptr_Image[6])(_image);
    iVar10 = (*_image->_vptr_Image[7])(_image);
    p.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3)0x0;
    p.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5)0x0;
    local_308 = __return_storage_ptr__;
    iVar11 = TriangulatorData::AddPoint(&data,&p);
    p.field_1.y = 0;
    p.field_0.x = iVar9 - 1U;
    iVar12 = TriangulatorData::AddPoint(&data,&p);
    p = (ivec2)((ulong)(iVar10 - 1U) << 0x20);
    iVar13 = TriangulatorData::AddPoint(&data,&p);
    p.field_1.y = iVar10 - 1U;
    iVar9 = TriangulatorData::AddPoint(&data,&p);
    iVar10 = TriangulatorData::AddTriangle(&data,iVar9,iVar11,iVar13,-1,-1,-1,-1);
    TriangulatorData::AddTriangle(&data,iVar11,iVar9,iVar12,iVar10,-1,-1,-1);
    TriangulatorData::Flush(&data,_image);
    local_228 = local_338 & 0xffffffff;
    local_230 = (ulong)local_30c;
    while( true ) {
      fVar1 = data.errors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start
              [*data.queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start];
      if ((fVar1 <= local_2fc) ||
         ((0 < (int)(float)local_338 &&
          (local_228 <=
           (ulong)((long)data.queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)data.queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2))))) break;
      if ((int)local_30c < 1) {
        if ((fVar1 == 0.0) && (!NAN(fVar1))) break;
      }
      else if (((fVar1 == 0.0) && (!NAN(fVar1))) ||
              (local_230 <=
               (ulong)((long)data.points.
                             super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)data.points.
                             super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3))) break;
      iVar11 = TriangulatorData::QueuePop(&data);
      local_340 = CONCAT44(extraout_var,iVar11);
      iVar10 = iVar11 * 3;
      iVar9 = data.triangles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10];
      local_218 = (long)data.triangles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar10 + 1];
      local_220 = (long)data.triangles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar10 + 2];
      vVar2 = data.points.
              super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar9];
      vVar3 = data.points.
              super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_218];
      vVar4 = data.points.
              super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_220];
      p = data.candidates.
          super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar11];
      iVar11 = TriangulatorData::AddPoint(&data,&p);
      aVar24 = vVar3.field_1;
      aVar19 = vVar2.field_1;
      aVar26 = p.field_0;
      aVar21 = vVar3.field_0;
      aVar20 = p.field_1;
      aVar23 = vVar2.field_0;
      handleCollinear.data = &data;
      if ((aVar26.x - aVar21.x) * (aVar24.y - aVar19.y) ==
          (aVar21.x - aVar23.x) * (aVar20.y - aVar24.y)) {
LAB_00229b2d:
        toTerrain::anon_class_8_1_898a9ca8::operator()(&handleCollinear,iVar11,iVar10);
      }
      else {
        aVar25 = vVar4.field_1;
        aVar27 = vVar4.field_0;
        if ((aVar26.x - aVar27.x) * (aVar25.y - aVar24.y) ==
            (aVar27.x - aVar21.x) * (aVar20.y - aVar25.y)) {
          iVar10 = (int)local_340 * 3 + 1;
          goto LAB_00229b2d;
        }
        if ((aVar26.x - aVar23.x) * (aVar19.y - aVar25.y) ==
            (aVar23.x - aVar27.x) * (aVar20.y - aVar19.y)) {
          iVar10 = (int)local_340 * 3 + 2;
          goto LAB_00229b2d;
        }
        local_340 = CONCAT44(local_340._4_4_,
                             data.halfedges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)iVar10 + 1]);
        local_300 = data.halfedges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar10 + 2];
        iVar12 = (int)local_218;
        iVar10 = TriangulatorData::AddTriangle
                           (&data,iVar9,iVar12,iVar11,
                            data.halfedges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar10],-1,-1,iVar10);
        iVar13 = (int)local_220;
        iVar12 = TriangulatorData::AddTriangle
                           (&data,iVar12,iVar13,iVar11,(int)(float)local_340,-1,iVar10 + 1,-1);
        iVar9 = TriangulatorData::AddTriangle
                          (&data,iVar13,iVar9,iVar11,local_300,iVar10 + 2,iVar12 + 1,-1);
        TriangulatorData::Legalize(&data,iVar10);
        TriangulatorData::Legalize(&data,iVar12);
        TriangulatorData::Legalize(&data,iVar9);
      }
      TriangulatorData::Flush(&data,_image);
    }
    texcoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texcoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texcoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    points.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    points.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    points.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::reserve(&points,(long)data.points.
                            super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)data.points.
                            super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::reserve(&texcoords,
              (long)data.points.
                    super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)data.points.
                    super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    uVar14 = (*_image->_vptr_Image[6])(_image);
    uVar15 = (*_image->_vptr_Image[7])(_image);
    local_338 = (ulong)uVar15;
    w1 = uVar14 - 1;
    h1 = uVar15 - 1;
    local_340 = (ulong)uVar14;
    for (; data.points.
           super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           data.points.
           super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        data.points.
        super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             data.points.
             super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      p.field_0.x = h1 - ((data.points.
                           super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_1).y;
      iVar9 = (*_image->_vptr_Image[0xe])
                        (_image,(long)((data.points.
                                        super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->field_0).x);
      (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_00,iVar9));
      handleCollinear.data._0_4_ = extraout_XMM0_Da * _zScale;
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::emplace_back<int_const&,int,float>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)&points,
                 (int *)data.points.
                        super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(int *)&p,
                 (float *)&handleCollinear);
      p.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3)
                  (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3)
                  ((float)((data.points.
                            super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0).x / (float)w1);
      handleCollinear.data._0_4_ =
           1.0 - (float)((data.points.
                          super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_1).y / (float)h1;
      std::
      vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
      ::emplace_back<float,float>
                ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                  *)&texcoords,(float *)&p,(float *)&handleCollinear);
    }
    triangles.
    super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    triangles.
    super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    triangles.
    super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ::reserve(&triangles,
              (long)data.queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)data.queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2);
    for (piVar29 = data.queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar29 !=
        data.queue.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; piVar29 = piVar29 + 1) {
      lVar16 = (long)*piVar29;
      std::
      vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>::
      emplace_back<int&,int&,int&>
                ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                  *)&triangles,
                 data.triangles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar16 * 3,
                 data.triangles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar16 * 3 + 1,
                 data.triangles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar16 * 3 + 2);
    }
    if (0.0 < local_328) {
      local_328 = -local_328;
      uStack_324 = uStack_324 ^ 0x80000000;
      uStack_320 = uStack_320 ^ 0x80000000;
      uStack_31c = uStack_31c ^ 0x80000000;
      local_208._M_left = &local_208;
      local_208._M_color = _S_red;
      local_208._M_parent = (_Base_ptr)0x0;
      local_1e8 = 0;
      x1s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &x1s._M_t._M_impl.super__Rb_tree_header._M_header;
      x1s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      x1s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      x1s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      y0s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &y0s._M_t._M_impl.super__Rb_tree_header._M_header;
      y0s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      y0s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      y0s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      y1s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &y1s._M_t._M_impl.super__Rb_tree_header._M_header;
      y1s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      y1s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      y1s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p = (ivec2)&p_Stack_238;
      p_Stack_238 = (__node_base_ptr)0x0;
      lVar16 = 0;
      local_208._M_right = local_208._M_left;
      y1s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           y1s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      y0s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           y0s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      x1s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           x1s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar28 = 0;
          pvVar7 = points.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar28 < (ulong)(((long)points.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)points.
                                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar28 = uVar28 + 1) {
        fVar1 = *(float *)((long)&(points.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar16);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          if ((fVar1 == (float)w1) && (!NAN(fVar1) && !NAN((float)w1))) {
            local_35c = *(mapped_type_conflict1 *)
                         ((long)&(points.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_2 + lVar16);
            pointIndex.lookup =
                 (unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                  *)CONCAT44(pointIndex.lookup._4_4_,
                             (int)*(float *)((long)&(points.
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  field_1 + lVar16));
            pmVar17 = std::
                      map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      ::operator[](&x1s,(key_type_conflict *)&pointIndex);
            goto LAB_00229f84;
          }
          bVar5 = false;
        }
        else {
          local_35c = *(mapped_type_conflict1 *)
                       ((long)&(points.
                                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_2 + lVar16);
          pointIndex.lookup =
               (unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                *)CONCAT44(pointIndex.lookup._4_4_,
                           (int)*(float *)((long)&(points.
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  field_1 + lVar16));
          pmVar17 = std::
                    map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
                    operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                *)&handleCollinear,(key_type_conflict *)&pointIndex);
LAB_00229f84:
          *pmVar17 = local_35c;
          bVar5 = true;
        }
        fVar1 = *(float *)((long)&pvVar7->field_1 + lVar16);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          if ((fVar1 == (float)h1) && (!NAN(fVar1) && !NAN((float)h1))) {
            local_35c = *(mapped_type_conflict1 *)((long)&pvVar7->field_2 + lVar16);
            pointIndex.lookup =
                 (unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                  *)CONCAT44(pointIndex.lookup._4_4_,
                             (int)*(float *)((long)&pvVar7->field_0 + lVar16));
            pmVar17 = std::
                      map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                      ::operator[](&y1s,(key_type_conflict *)&pointIndex);
            goto LAB_0022a005;
          }
          if (bVar5) goto LAB_0022a00f;
        }
        else {
          local_35c = *(mapped_type_conflict1 *)((long)&pvVar7->field_2 + lVar16);
          pointIndex.lookup =
               (unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
                *)CONCAT44(pointIndex.lookup._4_4_,(int)*(float *)((long)&pvVar7->field_0 + lVar16))
          ;
          pmVar17 = std::
                    map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
                    operator[](&y0s,(key_type_conflict *)&pointIndex);
LAB_0022a005:
          *pmVar17 = local_35c;
LAB_0022a00f:
          pmVar18 = std::__detail::
                    _Map_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>,_std::__detail::_Select1st,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>,_std::__detail::_Select1st,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&p,(key_type *)((long)&pvVar7->field_0 + lVar16));
          *pmVar18 = (mapped_type)uVar28;
        }
        lVar16 = lVar16 + 0xc;
      }
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)&sx0s,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)local_208._M_left,&local_208,
                 (allocator_type *)&pointIndex);
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)&sx1s,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)
                 x1s._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)
                 &x1s._M_t._M_impl.super__Rb_tree_header,(allocator_type *)&pointIndex);
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)&sy0s,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)
                 y0s._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)
                 &y0s._M_t._M_impl.super__Rb_tree_header,(allocator_type *)&pointIndex);
      std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,float>>,void>
                ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)&sy1s,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)
                 y1s._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_iterator<std::pair<const_int,_float>_>)
                 &y1s._M_t._M_impl.super__Rb_tree_header,(allocator_type *)&pointIndex);
      pointIndex.lookup =
           (unordered_map<glm::vec<3,_float,_(glm::qualifier)0>,_int,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>_>
            *)&p;
      pointIndex.points = &points;
      pointIndex.w1 = &w1;
      pointIndex.h1 = &h1;
      pointIndex.texcoords = &texcoords;
      center = toTerrain::anon_class_40_5_2ea28a1b::operator()
                         (&pointIndex,(float)(int)(float)local_340 * 0.5,
                          (float)(int)(float)local_338 * 0.5,local_328);
      for (uVar28 = 1;
          uVar28 < (ulong)((long)sx0s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sx0s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar28 = uVar28 + 1) {
        iVar9 = sx0s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28].first;
        fVar1 = sx0s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28 - 1].second;
        local_338 = CONCAT44(local_338._4_4_,
                             sx0s.
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar28].second);
        local_340 = CONCAT44(local_340._4_4_,
                             (float)sx0s.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first);
        p00 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,0.0,
                         (float)sx0s.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first,
                         local_328);
        p01 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,0.0,(float)local_340,fVar1);
        p10 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,0.0,(float)iVar9,local_328);
        p11 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,0.0,(float)iVar9,(float)local_338);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p01,&p10,&p00);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p01,&p11,&p10);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&center,&p00,&p10);
      }
      for (uVar28 = 1;
          uVar28 < (ulong)((long)sx1s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sx1s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar28 = uVar28 + 1) {
        iVar9 = sx1s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28].first;
        fVar1 = sx1s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28 - 1].second;
        local_338 = CONCAT44(local_338._4_4_,
                             sx1s.
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar28].second);
        local_340 = CONCAT44(local_340._4_4_,
                             (float)sx1s.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first);
        p00 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)w1,
                         (float)sx1s.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first,
                         local_328);
        p01 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)w1,(float)local_340,fVar1);
        p10 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)w1,(float)iVar9,local_328);
        p11 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)w1,(float)iVar9,(float)local_338);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p00,&p10,&p01);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p10,&p11,&p01);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&center,&p10,&p00);
      }
      for (uVar28 = 1;
          uVar28 < (ulong)((long)sy0s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sy0s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar28 = uVar28 + 1) {
        iVar9 = sy0s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28].first;
        fVar1 = sy0s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28 - 1].second;
        local_338 = CONCAT44(local_338._4_4_,
                             sy0s.
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar28].second);
        local_340 = CONCAT44(local_340._4_4_,
                             (float)sy0s.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first);
        p00 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,
                         (float)sy0s.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first,0.0,
                         local_328);
        p01 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)local_340,0.0,fVar1);
        p10 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)iVar9,0.0,local_328);
        p11 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)iVar9,0.0,(float)local_338);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p00,&p10,&p01);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p10,&p11,&p01);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&center,&p10,&p00);
      }
      for (uVar28 = 1;
          uVar28 < (ulong)((long)sy1s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sy1s.
                                 super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar28 = uVar28 + 1) {
        iVar9 = sy1s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28].first;
        fVar1 = sy1s.
                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar28 - 1].second;
        local_338 = CONCAT44(local_338._4_4_,
                             sy1s.
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar28].second);
        local_340 = CONCAT44(local_340._4_4_,
                             (float)sy1s.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first);
        p00 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,
                         (float)sy1s.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].first,
                         (float)h1,local_328);
        p01 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)local_340,(float)h1,fVar1);
        p10 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)iVar9,(float)h1,local_328);
        p11 = toTerrain::anon_class_40_5_2ea28a1b::operator()
                        (&pointIndex,(float)iVar9,(float)h1,(float)local_338);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p01,&p10,&p00);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&p01,&p11,&p10);
        std::
        vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
        ::emplace_back<int_const&,int_const&,int_const&>
                  ((vector<glm::vec<3,int,(glm::qualifier)0>,std::allocator<glm::vec<3,int,(glm::qualifier)0>>>
                    *)&triangles,&center,&p00,&p10);
      }
      std::_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
      ~_Vector_base(&sy1s.
                     super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                   );
      std::_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
      ~_Vector_base(&sy0s.
                     super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                   );
      std::_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
      ~_Vector_base(&sx1s.
                     super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                   );
      std::_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
      ~_Vector_base(&sx0s.
                     super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                   );
      std::
      _Hashtable<glm::vec<3,_float,_(glm::qualifier)0>,_std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>,_std::__detail::_Select1st,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<glm::vec<3,_float,_(glm::qualifier)0>,_std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>,_std::allocator<std::pair<const_glm::vec<3,_float,_(glm::qualifier)0>,_int>_>,_std::__detail::_Select1st,_std::equal_to<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::hash<glm::vec<3,_float,_(glm::qualifier)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&p);
      std::
      _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
      ::~_Rb_tree(&y1s._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
      ::~_Rb_tree(&y0s._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
      ::~_Rb_tree(&x1s._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                   *)&handleCollinear);
    }
    Mesh::Mesh(local_308);
    pvVar7 = points.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __return_storage_ptr__ = local_308;
    for (_point = points.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar8 = texcoords.
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        _uv = texcoords.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start, _point != pvVar7; _point = _point + 1) {
      Mesh::addVertex(__return_storage_ptr__,_point);
    }
    for (; pvVar6 = triangles.
                    super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        pvVar22 = triangles.
                  super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, _uv != pvVar8; _uv = _uv + 1) {
      Mesh::addTexCoord(__return_storage_ptr__,_uv);
    }
    for (; pvVar22 != pvVar6; pvVar22 = pvVar22 + 1) {
      Mesh::addTriangleIndices
                (__return_storage_ptr__,(pvVar22->field_0).x,(pvVar22->field_1).y,
                 (pvVar22->field_2).z);
    }
    std::
    _Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&triangles.
                     super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&points.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&texcoords.
                     super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   );
    TriangulatorData::~TriangulatorData(&data);
  }
  else {
    Mesh::Mesh(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh toTerrain( const Image& _image,
                const float _zScale,
                const float _maxError, const float _baseHeight, 
                const int _maxTriangles, const int _maxPoints) {

    if (_image.getChannels() != 1)
        return Mesh();

    TriangulatorData data;

    // add points at all four corners
    const int x0 = 0;
    const int y0 = 0;
    const int x1 = _image.getWidth() - 1;
    const int y1 = _image.getHeight() - 1;
    const int p0 = data.AddPoint(glm::ivec2(x0, y0));
    const int p1 = data.AddPoint(glm::ivec2(x1, y0));
    const int p2 = data.AddPoint(glm::ivec2(x0, y1));
    const int p3 = data.AddPoint(glm::ivec2(x1, y1));

    // add initial two triangles
    const int t0 = data.AddTriangle(p3, p0, p2, -1, -1, -1, -1);
    data.AddTriangle(p0, p3, p1, t0, -1, -1, -1);
    data.Flush(_image);

    // helper function to check if triangulation is complete
    const auto done = [&]() {
        const float e = data.errors[data.queue[0]];
        if (e <= _maxError) {
            return true;
        }
        if (_maxTriangles > 0 && data.queue.size() >= _maxTriangles) {
            return true;
        }
        if (_maxPoints > 0 && data.points.size() >= _maxPoints) {
            return true;
        }
        return e == 0;
    };

    while (!done()) {
        // pop triangle with highest error from priority queue
        const int t = data.QueuePop();

        const int e0 = t * 3 + 0;
        const int e1 = t * 3 + 1;
        const int e2 = t * 3 + 2;

        const int p0 = data.triangles[e0];
        const int p1 = data.triangles[e1];
        const int p2 = data.triangles[e2];

        const glm::ivec2 a = data.points[p0];
        const glm::ivec2 b = data.points[p1];
        const glm::ivec2 c = data.points[p2];
        const glm::ivec2 p = data.candidates[t];

        const int pn = data.AddPoint(p);

        const auto collinear = []( const glm::ivec2 p0, const glm::ivec2 p1, const glm::ivec2 p2) {
            return (p1.y-p0.y)*(p2.x-p1.x) == (p2.y-p1.y)*(p1.x-p0.x);
        };

        const auto handleCollinear = [&](const int pn, const int a) {
            const int a0 = a - a % 3;
            const int al = a0 + (a + 1) % 3;
            const int ar = a0 + (a + 2) % 3;
            const int p0 = data.triangles[ar];
            const int pr = data.triangles[a];
            const int pl = data.triangles[al];
            const int hal = data.halfedges[al];
            const int har = data.halfedges[ar];

            const int b = data.halfedges[a];

            if (b < 0) {
                const int t0 = data.AddTriangle(pn, p0, pr, -1, har, -1, a0);
                const int t1 = data.AddTriangle(p0, pn, pl, t0, -1, hal, -1);
                data.Legalize(t0 + 1);
                data.Legalize(t1 + 2);
                return;
            }

            const int b0 = b - b % 3;
            const int bl = b0 + (b + 2) % 3;
            const int br = b0 + (b + 1) % 3;
            const int p1 = data.triangles[bl];
            const int hbl = data.halfedges[bl];
            const int hbr = data.halfedges[br];

            data.QueueRemove(b / 3);

            const int t0 = data.AddTriangle(p0, pr, pn, har, -1, -1, a0);
            const int t1 = data.AddTriangle(pr, p1, pn, hbr, -1, t0 + 1, b0);
            const int t2 = data.AddTriangle(p1, pl, pn, hbl, -1, t1 + 1, -1);
            const int t3 = data.AddTriangle(pl, p0, pn, hal, t0 + 2, t2 + 1, -1);

            data.Legalize(t0);
            data.Legalize(t1);
            data.Legalize(t2);
            data.Legalize(t3);
        };

        if (collinear(a, b, p))
            handleCollinear(pn, e0);
        else if (collinear(b, c, p))
            handleCollinear(pn, e1);
        else if (collinear(c, a, p))
            handleCollinear(pn, e2);
        else {
            const int h0 = data.halfedges[e0];
            const int h1 = data.halfedges[e1];
            const int h2 = data.halfedges[e2];

            const int t0 = data.AddTriangle(p0, p1, pn, h0, -1, -1, e0);
            const int t1 = data.AddTriangle(p1, p2, pn, h1, -1, t0 + 1, -1);
            const int t2 = data.AddTriangle(p2, p0, pn, h2, t0 + 2, t1 + 1, -1);

            data.Legalize(t0);
            data.Legalize(t1);
            data.Legalize(t2);
        }

        data.Flush(_image);
    }

    std::vector<glm::vec2> texcoords;
    std::vector<glm::vec3> points;
    points.reserve(data.points.size());
    texcoords.reserve(data.points.size());
    const int w = _image.getWidth();
    const int h = _image.getHeight();
    const int w1 = w - 1;
    const int h1 = h - 1;

    for (const glm::ivec2 &p : data.points) {
        points.emplace_back(p.x, h1 - p.y, _image.getValue( _image.getIndex(p.x, p.y) ) * _zScale);
        texcoords.emplace_back(p.x/float(w1), 1.0f-p.y/float(h1));
    }

    std::vector<glm::ivec3> triangles;
    triangles.reserve(data.queue.size());
    for (const int i : data.queue) {
        triangles.emplace_back(
            data.triangles[i * 3 + 0],
            data.triangles[i * 3 + 1],
            data.triangles[i * 3 + 2] );
    }

    // BASE
    //
    
    if ( _baseHeight > 0.0f ) {
        const float z = -_baseHeight;// * _zScale;
        
        std::map<int, float> x0s;
        std::map<int, float> x1s;
        std::map<int, float> y0s;
        std::map<int, float> y1s;
        std::unordered_map<glm::vec3, int> lookup;

        // find points along each edge
        for (int i = 0; i < points.size(); i++) {
            const auto &p = points[i];
            bool edge = false;

            if (p.x == 0) {
                x0s[p.y] = p.z;
                edge = true;
            }
            else if (p.x == w1) {
                x1s[p.y] = p.z;
                edge = true;
            }

            if (p.y == 0) {
                y0s[p.x] = p.z;
                edge = true;
            }
            else if (p.y == h1) {
                y1s[p.x] = p.z;
                edge = true;
            }

            if (edge)
                lookup[p] = i;
        }

        std::vector<std::pair<int, float>> sx0s(x0s.begin(), x0s.end());
        std::vector<std::pair<int, float>> sx1s(x1s.begin(), x1s.end());
        std::vector<std::pair<int, float>> sy0s(y0s.begin(), y0s.end());
        std::vector<std::pair<int, float>> sy1s(y1s.begin(), y1s.end());

        const auto pointIndex = [&lookup, &points, &texcoords, &w1, &h1](
            const float x, const float y, const float z)
        {
            const glm::vec3 point(x, y, z);
            if (lookup.find(point) == lookup.end()) {
                lookup[point] = points.size();
                points.push_back(point);
                texcoords.push_back( glm::vec2(x/float(w1), y/float(h1)) );
            }
            return lookup[point];
        };

        // compute base center point
        const int center = pointIndex(w * 0.5f, h * 0.5f, z);

        // edge x = 0
        for (int i = 1; i < sx0s.size(); i++) {
            const int y0 = sx0s[i-1].first;
            const int y1 = sx0s[i].first;
            const float z0 = sx0s[i-1].second;
            const float z1 = sx0s[i].second;
            const int p00 = pointIndex(0, y0, z);
            const int p01 = pointIndex(0, y0, z0);
            const int p10 = pointIndex(0, y1, z);
            const int p11 = pointIndex(0, y1, z1);
            triangles.emplace_back(p01, p10, p00);
            triangles.emplace_back(p01, p11, p10);
            triangles.emplace_back(center, p00, p10);
        }

        // edge x = w1
        for (int i = 1; i < sx1s.size(); i++) {
            const int y0 = sx1s[i-1].first;
            const int y1 = sx1s[i].first;
            const float z0 = sx1s[i-1].second;
            const float z1 = sx1s[i].second;
            const int p00 = pointIndex(w1, y0, z);
            const int p01 = pointIndex(w1, y0, z0);
            const int p10 = pointIndex(w1, y1, z);
            const int p11 = pointIndex(w1, y1, z1);
            triangles.emplace_back(p00, p10, p01);
            triangles.emplace_back(p10, p11, p01);
            triangles.emplace_back(center, p10, p00);
        }

        // edge y = 0
        for (int i = 1; i < sy0s.size(); i++) {
            const int x0 = sy0s[i-1].first;
            const int x1 = sy0s[i].first;
            const float z0 = sy0s[i-1].second;
            const float z1 = sy0s[i].second;
            const int p00 = pointIndex(x0, 0, z);
            const int p01 = pointIndex(x0, 0, z0);
            const int p10 = pointIndex(x1, 0, z);
            const int p11 = pointIndex(x1, 0, z1);
            triangles.emplace_back(p00, p10, p01);
            triangles.emplace_back(p10, p11, p01);
            triangles.emplace_back(center, p10, p00);
        }

        // edge y = h1
        for (int i = 1; i < sy1s.size(); i++) {
            const int x0 = sy1s[i-1].first;
            const int x1 = sy1s[i].first;
            const float z0 = sy1s[i-1].second;
            const float z1 = sy1s[i].second;
            const int p00 = pointIndex(x0, h1, z);
            const int p01 = pointIndex(x0, h1, z0);
            const int p10 = pointIndex(x1, h1, z);
            const int p11 = pointIndex(x1, h1, z1);
            triangles.emplace_back(p01, p10, p00);
            triangles.emplace_back(p01, p11, p10);
            triangles.emplace_back(center, p00, p10);
        }
    }

    Mesh mesh;

    for (const glm::vec3 &p : points)
        mesh.addVertex( p );

    for (const glm::vec2 &t : texcoords)
        mesh.addTexCoord( t );
    
    for (const glm::ivec3 &tri : triangles)
        mesh.addTriangleIndices( tri[0], tri[1], tri[2] );

    return mesh;
}